

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O2

UText * __thiscall
icu_63::RegexMatcher::replaceAll
          (RegexMatcher *this,UText *replacement,UText *dest,UErrorCode *status)

{
  UBool UVar1;
  UnicodeString emptyString;
  UText empty;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->fDeferredStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      if (dest == (UText *)0x0) {
        emptyString.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)&PTR__UnicodeString_0024c170;
        emptyString.fUnion.fStackFields.fLengthAndFlags = 2;
        memset(&empty,0,0x90);
        empty.magic = 0x345ad82c;
        empty.sizeOfStruct = 0x90;
        utext_openUnicodeString_63(&empty,&emptyString,status);
        dest = utext_clone_63((UText *)0x0,&empty,'\x01','\0',status);
        utext_close_63(&empty);
        UnicodeString::~UnicodeString(&emptyString);
        if (U_ZERO_ERROR < *status) {
          return dest;
        }
      }
      reset(this);
      do {
        UVar1 = find(this);
        if (UVar1 == '\0') break;
        appendReplacement(this,dest,replacement,status);
      } while (*status < U_ILLEGAL_ARGUMENT_ERROR);
      appendTail(this,dest,status);
    }
    else {
      *status = this->fDeferredStatus;
    }
  }
  return dest;
}

Assistant:

UText *RegexMatcher::replaceAll(UText *replacement, UText *dest, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return dest;
    }
    if (U_FAILURE(fDeferredStatus)) {
        status = fDeferredStatus;
        return dest;
    }

    if (dest == NULL) {
        UnicodeString emptyString;
        UText empty = UTEXT_INITIALIZER;

        utext_openUnicodeString(&empty, &emptyString, &status);
        dest = utext_clone(NULL, &empty, TRUE, FALSE, &status);
        utext_close(&empty);
    }

    if (U_SUCCESS(status)) {
        reset();
        while (find()) {
            appendReplacement(dest, replacement, status);
            if (U_FAILURE(status)) {
                break;
            }
        }
        appendTail(dest, status);
    }

    return dest;
}